

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.cpp
# Opt level: O0

int __thiscall blc::tools::pipe::pipe(pipe *this,int *__pipedes)

{
  undefined1 uVar1;
  string *psVar2;
  mutex *pmVar3;
  byte in_DL;
  pipe *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  
  stream::stream(&this->super_stream);
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_00130a20;
  std::shared_ptr<bool>::shared_ptr((shared_ptr<bool> *)0x11b2b6);
  psVar2 = getIn_abi_cxx11_((pipe *)__pipedes);
  this->_in = psVar2;
  psVar2 = getOut_abi_cxx11_((pipe *)__pipedes);
  this->_out = psVar2;
  pmVar3 = getInMut((pipe *)__pipedes);
  this->_inMut = pmVar3;
  pmVar3 = getOutMut((pipe *)__pipedes);
  this->_outMut = pmVar3;
  uVar1 = getBlock((pipe *)__pipedes);
  this->_block = (bool)uVar1;
  getClosed(in_stack_ffffffffffffff88);
  std::shared_ptr<bool>::operator=
            ((shared_ptr<bool> *)CONCAT17(uVar1,in_stack_ffffffffffffff90),
             (shared_ptr<bool> *)in_stack_ffffffffffffff88);
  std::shared_ptr<bool>::~shared_ptr((shared_ptr<bool> *)0x11b37f);
  this->_master = (bool)(in_DL & 1);
  return (int)this;
}

Assistant:

blc::tools::pipe::pipe(const pipe &other, bool state) {
	this->_in = const_cast<blc::tools::pipe &>(other).getIn();
	this->_out = const_cast<blc::tools::pipe &>(other).getOut();
	this->_inMut = const_cast<blc::tools::pipe &>(other).getInMut();
	this->_outMut = const_cast<blc::tools::pipe &>(other).getOutMut();
	this->_block = const_cast<blc::tools::pipe &>(other).getBlock();
	this->_closed = const_cast<blc::tools::pipe &>(other).getClosed();
	this->_master = state;
}